

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen12dGPUResource_Test2DMippedResourceAutoTiling_Test::
CTestGen12dGPUResource_Test2DMippedResourceAutoTiling_Test
          (CTestGen12dGPUResource_Test2DMippedResourceAutoTiling_Test *this)

{
  CTestGen12dGPUResource_Test2DMippedResourceAutoTiling_Test *this_local;
  
  CTestGen12dGPUResource::CTestGen12dGPUResource(&this->super_CTestGen12dGPUResource);
  (this->super_CTestGen12dGPUResource).super_CTestGen10Resource.super_CTestGen9Resource.
  super_CTestResource.super_CommonULT.super_Test._vptr_Test =
       (_func_int **)&PTR__CTestGen12dGPUResource_Test2DMippedResourceAutoTiling_Test_00268cb8;
  return;
}

Assistant:

TEST_F(CTestGen12dGPUResource, Test2DMippedResourceAutoTiling)
{
    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.MaxLod               = 5;
    gmmParams.ArraySize            = 4;

    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x120;
        gmmParams.BaseHeight  = 0x120;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        GMM_RESOURCE_INFO *ResourceInfo2;
        ResourceInfo2 = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        //Verify Gmm tile-selection able to get same tiling mode for resources created with same GmmParams
        //... where 1st iteration uses auto-tile-selection, and next creates with previouly selected tile-mode.
        //Below ensures, Gmm modified gmmParams to final tile-mode, or left it at initial (no tiling selection).
        EXPECT_EQ(ResourceInfo->GmmGetTileMode(), ResourceInfo2->GmmGetTileMode());

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo2);
    }
}